

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)10,(moira::Mode)2,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  char *pcVar7;
  char cVar8;
  
  *addr = *addr + 2;
  iVar4 = (*this->_vptr_Moira[5])();
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])(this);
  bVar6 = str->upper;
  pcVar7 = "andi";
  if ((bool)bVar6 != false) {
    pcVar7 = "ANDI";
  }
  cVar8 = *pcVar7;
  if (cVar8 != '\0') {
    do {
      pcVar7 = pcVar7 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar8;
      cVar8 = *pcVar7;
    } while (cVar8 != '\0');
    bVar6 = str->upper;
  }
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar6 & 1) << 5 | 0x4c;
  iVar1 = (this->tab).raw;
  while (pcVar7 = str->ptr, pcVar7 < str->base + iVar1) {
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  str->ptr = pcVar7 + 1;
  *pcVar7 = '#';
  StrWriter::operator<<(str,(UInt)(iVar4 << 0x10 | uVar5 & 0xffff));
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ' ';
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = '(';
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ')';
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}